

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void WriteCompactSize<ParamsStream<VectorWriter&,CAddress::SerParams>>
               (ParamsStream<VectorWriter_&,_CAddress::SerParams> *os,uint64_t nSize)

{
  long lVar1;
  unsigned_short uVar2;
  uint uVar3;
  ulong in_RSI;
  ParamsStream<VectorWriter_&,_CAddress::SerParams> *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_00000008;
  undefined2 in_stack_0000000c;
  undefined1 in_stack_0000000e;
  uint8_t in_stack_0000000f;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI < 0xfd) {
    ser_writedata8<ParamsStream<VectorWriter&,CAddress::SerParams>>(in_RDI,in_stack_0000000f);
  }
  else {
    uVar2 = std::numeric_limits<unsigned_short>::max();
    if (uVar2 < in_RSI) {
      uVar3 = std::numeric_limits<unsigned_int>::max();
      if (uVar3 < in_RSI) {
        ser_writedata8<ParamsStream<VectorWriter&,CAddress::SerParams>>(in_RDI,in_stack_0000000f);
        ser_writedata64<ParamsStream<VectorWriter&,CAddress::SerParams>>
                  (in_RDI,CONCAT17(in_stack_0000000f,
                                   CONCAT16(in_stack_0000000e,
                                            CONCAT24(in_stack_0000000c,in_stack_00000008))));
      }
      else {
        ser_writedata8<ParamsStream<VectorWriter&,CAddress::SerParams>>(in_RDI,in_stack_0000000f);
        ser_writedata32<ParamsStream<VectorWriter&,CAddress::SerParams>>
                  (in_RDI,CONCAT13(in_stack_0000000f,CONCAT12(in_stack_0000000e,in_stack_0000000c)))
        ;
      }
    }
    else {
      ser_writedata8<ParamsStream<VectorWriter&,CAddress::SerParams>>(in_RDI,in_stack_0000000f);
      ser_writedata16<ParamsStream<VectorWriter&,CAddress::SerParams>>
                (in_RDI,CONCAT11(in_stack_0000000f,in_stack_0000000e));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void WriteCompactSize(Stream& os, uint64_t nSize)
{
    if (nSize < 253)
    {
        ser_writedata8(os, nSize);
    }
    else if (nSize <= std::numeric_limits<uint16_t>::max())
    {
        ser_writedata8(os, 253);
        ser_writedata16(os, nSize);
    }
    else if (nSize <= std::numeric_limits<unsigned int>::max())
    {
        ser_writedata8(os, 254);
        ser_writedata32(os, nSize);
    }
    else
    {
        ser_writedata8(os, 255);
        ser_writedata64(os, nSize);
    }
    return;
}